

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall
AccelParam::StartAccel
          (AccelParam *this,double _startSpeed,double _targetSpeed,double _accel,double _startTime)

{
  double dVar1;
  
  if (_accel <= 0.0) {
    if (_startSpeed <= _targetSpeed) {
      return;
    }
  }
  else if (_targetSpeed <= _startSpeed) {
    return;
  }
  this->currSpeed_m_s = _startSpeed;
  this->currSpeed_kt = _startSpeed * 1.94384;
  this->targetDeltaDist = NAN;
  this->startSpeed = _startSpeed;
  this->targetSpeed = _targetSpeed;
  this->acceleration = _accel;
  dVar1 = (double)((ulong)currCycle.simTime & -(ulong)NAN(_startTime) |
                  ~-(ulong)NAN(_startTime) & (ulong)_startTime);
  this->accelStartTime = dVar1;
  this->startTime = dVar1;
  dVar1 = (_targetSpeed - _startSpeed) / _accel + dVar1;
  this->targetTime = dVar1;
  dVar1 = getDeltaDist(this,dVar1);
  this->targetDeltaDist = dVar1;
  return;
}

Assistant:

void AccelParam::StartAccel(double _startSpeed, double _targetSpeed,
                            double _accel, double _startTime)
{
    // Sanity check
    if (!(_accel > 0 ? _targetSpeed > _startSpeed : _targetSpeed < _startSpeed))
        return;
    
    // reset
    SetSpeed(_startSpeed);
    
    // set values
    startSpeed = _startSpeed;
    targetSpeed = _targetSpeed;
    acceleration = _accel;
    startTime = accelStartTime = std::isnan(_startTime) ? currCycle.simTime : _startTime;

    // pre-calculate the target delta distance, needed for ratio-calculation
    targetTime = startTime + (targetSpeed - startSpeed)/acceleration;
    targetDeltaDist = getDeltaDist(targetTime);
}